

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Plugin.cpp
# Opt level: O3

void __thiscall RenX::Plugin::~Plugin(Plugin *this)

{
  pointer __dest;
  Core *pCVar1;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *pvVar2;
  pointer ppPVar3;
  pointer __src;
  
  *(undefined ***)this = &PTR_think_0015c378;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_0015c858;
  pCVar1 = getCore();
  pvVar2 = Core::getPlugins(pCVar1);
  ppPVar3 = (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  __dest = ppPVar3;
  do {
    if (ppPVar3 ==
        (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00126d79:
      Jupiter::Plugin::~Plugin(&this->super_Plugin);
      return;
    }
    __src = __dest + 1;
    if (*ppPVar3 == this) {
      pCVar1 = getCore();
      pvVar2 = Core::getPlugins(pCVar1);
      ppPVar3 = (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      if (__src != ppPVar3) {
        memmove(__dest,__src,(long)ppPVar3 - (long)__src);
        ppPVar3 = (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      (pvVar2->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppPVar3 + -1;
      goto LAB_00126d79;
    }
    ppPVar3 = ppPVar3 + 1;
    __dest = __src;
  } while( true );
}

Assistant:

RenX::Plugin::~Plugin() {
	auto& renx_plugins = RenX::getCore()->getPlugins();
	for (auto itr = renx_plugins.begin(); itr != renx_plugins.end(); ++itr) {
		if (*itr == this) {
			RenX::getCore()->getPlugins().erase(itr);
			break;
		}
	}
}